

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  element_type *peVar2;
  optional<std::shared_ptr<ExpressionAstNode>_> local_b0;
  optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> local_98;
  optional<std::shared_ptr<LiteralExpressionAstNode>_> local_80;
  optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> local_68;
  optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> local_48;
  undefined1 local_19;
  element_type *local_18;
  Parser *this_local;
  optional<std::shared_ptr<ExpressionAstNode>_> *e;
  
  local_18 = (element_type *)this;
  this_local = (Parser *)__return_storage_ptr__;
  skipWhiteSpace(this);
  local_19 = 0;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::optional(__return_storage_ptr__);
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffd0);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &stack0xffffffffffffffd0);
  TVar1 = peVar2->tokenType;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffd0);
  switch(TVar1) {
  case LeftCurly:
    parseObjectDeclarationExpression(&local_48,this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,&local_48);
    std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>::~optional(&local_48);
    skipWhiteSpace(this);
    break;
  default:
    parseIdentifierOrFunctionInvocationExpression(&local_b0,this);
    std::optional<std::shared_ptr<ExpressionAstNode>_>::operator=(__return_storage_ptr__,&local_b0);
    std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional(&local_b0);
    skipWhiteSpace(this);
    break;
  case Function:
    parseFunctionDeclarationExpression(&local_68,this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,&local_68);
    std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::~optional(&local_68);
    skipWhiteSpace(this);
    break;
  case BooleanLiteral:
  case UndefinedLiteral:
  case StringLiteral:
  case IntegerLiteral:
  case FloatLiteral:
    parseLiteralExpression(&local_80,this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,&local_80);
    std::optional<std::shared_ptr<LiteralExpressionAstNode>_>::~optional(&local_80);
    skipWhiteSpace(this);
    break;
  case BuiltInFunctionName:
    parseBuiltInFunctionInvocationExpression(&local_98,this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,&local_98);
    std::optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>::~optional
              (&local_98);
    skipWhiteSpace(this);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseExpression() noexcept {
  this->skipWhiteSpace();

  std::optional<std::shared_ptr<ExpressionAstNode>> e;

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::LeftCurly:
      e = this->parseObjectDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::Function:
      e = this->parseFunctionDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      e = this->parseLiteralExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BuiltInFunctionName:
      e = this->parseBuiltInFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
    default:
      e = this->parseIdentifierOrFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
  }
}